

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O1

void __thiscall
StunMsg_RFC5769SampleRequest_Test::~StunMsg_RFC5769SampleRequest_Test
          (StunMsg_RFC5769SampleRequest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StunMsg, RFC5769SampleRequest) {
  const char software_name[] = "STUN test client";
  const char username[] = "evtj:h6vY";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x58, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x10, //    SOFTWARE attribute header
    0x53,0x54,0x55,0x4e, // }
    0x20,0x74,0x65,0x73, // }  User-agent...
    0x74,0x20,0x63,0x6c, // }  ...name
    0x69,0x65,0x6e,0x74, // }
    0x00,0x24,0x00,0x04, //    PRIORITY attribute header
    0x6e,0x00,0x01,0xff, //    ICE priority value
    0x80,0x29,0x00,0x08, //    ICE-CONTROLLED attribute header
    0x93,0x2f,0xf9,0xb1, // }  Pseudo-random tie breaker...
    0x51,0x26,0x3b,0x36, // }   ...for ICE control
    0x00,0x06,0x00,0x09, //    USERNAME attribute header
    0x65,0x76,0x74,0x6a, // }
    0x3a,0x68,0x36,0x76, // }  Username (9 bytes) and padding (3 bytes)
    0x59,0x20,0x20,0x20, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x9a,0xea,0xa7,0x0c, // }
    0xbf,0xd8,0xcb,0x56, // }
    0x78,0x1e,0xf2,0xb5, // }  HMAC-SHA1 fingerprint
    0xb2,0xd3,0xf2,0x49, // }
    0xc1,0xb5,0x71,0xa2, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xe5,0x7a,0x3b,0xcf, //    CRC0x32, fingerprint
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_VARSIZE_SIZE(sizeof(software_name) - 1)
    + STUN_ATTR_UINT32_SIZE
    + STUN_ATTR_UINT64_SIZE
    + STUN_ATTR_VARSIZE_SIZE(sizeof(username) - 1)
    + STUN_ATTR_MSGINT_SIZE
    + STUN_ATTR_FINGERPRINT_SIZE];

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  stun_msg_hdr_init(msg_hdr, STUN_BINDING_REQUEST, tsx_id);  
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_SOFTWARE, software_name,
        sizeof(software_name)-1, ' ');
  stun_attr_uint32_add(msg_hdr, STUN_ATTR_PRIORITY, 0x6e0001fful);
  stun_attr_uint64_add(msg_hdr, STUN_ATTR_ICE_CONTROLLED, 0x932ff9b151263b36ull);
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_USERNAME, username,
        sizeof(username)-1, ' ');
  stun_attr_msgint_add(msg_hdr, password, sizeof(password)-1);
  stun_attr_fingerprint_add(msg_hdr);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_REQUEST, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_SOFTWARE, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(software_name)-1, stun_attr_len(attr_hdr));
  const void* data = (uint8_t*)stun_attr_varsize_read(
    (stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, software_name, sizeof(software_name)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_PRIORITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(0x6e0001fful, stun_attr_uint32_read((stun_attr_uint32*)attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_ICE_CONTROLLED, stun_attr_type(attr_hdr));
  EXPECT_EQ(0x932ff9b151263b36ull,
      stun_attr_uint64_read((stun_attr_uint64*)attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_USERNAME, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(username)-1, stun_attr_len(attr_hdr));
  data = stun_attr_varsize_read((stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, username, sizeof(username)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_MESSAGE_INTEGRITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(1, stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr,
      (uint8_t*)password, sizeof(password)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_FINGERPRINT, stun_attr_type(attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}